

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O1

void * install_response_handler
                 (CManager cm,int stone_id,char *response_spec,void *param_4,FMFormat **ref_ptr)

{
  FMFormat **ppp_Var1;
  CManager cm_00;
  int iVar2;
  char *pcVar3;
  FMStructDescRec *pFVar4;
  undefined4 *puVar5;
  FMStructDescList p_Var6;
  FMStructDescList p_Var7;
  void *pvVar8;
  size_t sVar9;
  char *pcVar10;
  void *pvVar11;
  FMFormat p_Var12;
  FMFormat *pp_Var13;
  long lVar14;
  int iVar15;
  FMStructDescList f;
  FMStructDescRec *pFVar16;
  long lVar17;
  int format_count;
  int format_count2;
  int local_60;
  int local_5c;
  undefined4 *local_58;
  FMFormat **local_50;
  CManager local_48;
  void *local_40;
  void *local_38;
  
  local_48 = cm;
  iVar2 = strncmp("Terminal Action",response_spec,0xf);
  if (iVar2 == 0) {
    __isoc99_sscanf(response_spec + 0x10,"  Format Count %d\n",&local_60);
    pcVar3 = strchr(response_spec + 0x10,10);
    response_spec = pcVar3 + 1;
    pFVar4 = (FMStructDescRec *)INT_CMmalloc((long)local_60 * 0x20 + 0x20);
    if (0 < local_60) {
      lVar17 = 0;
      pFVar16 = pFVar4;
      do {
        response_spec = parse_FMformat_from_string(response_spec,pFVar16);
        lVar17 = lVar17 + 1;
        pFVar16 = pFVar16 + 1;
      } while (lVar17 < local_60);
    }
    pFVar4[local_60].format_name = (char *)0x0;
  }
  iVar2 = strncmp("Filter Action",response_spec,0xd);
  local_50 = ref_ptr;
  if (iVar2 == 0) {
    puVar5 = (undefined4 *)INT_CMmalloc(0x48);
    __isoc99_sscanf(response_spec + 0xe,"  Format Count %d\n",&local_60);
    pcVar3 = strchr(response_spec + 0xe,10);
    pcVar3 = pcVar3 + 1;
    p_Var6 = (FMStructDescList)INT_CMmalloc((long)local_60 * 0x20 + 0x20);
    if (0 < local_60) {
      lVar17 = 0;
      p_Var7 = p_Var6;
      do {
        pcVar3 = parse_FMformat_from_string(pcVar3,p_Var7);
        lVar17 = lVar17 + 1;
        p_Var7 = p_Var7 + 1;
      } while (lVar17 < local_60);
    }
    p_Var6[local_60].format_name = (char *)0x0;
    sVar9 = strlen(pcVar3);
    pcVar10 = (char *)INT_CMmalloc(sVar9 + 1);
    strcpy(pcVar10,pcVar3);
    *puVar5 = 0;
  }
  else {
    iVar2 = strncmp("Router Action",response_spec,0xd);
    if (iVar2 != 0) {
      iVar2 = strncmp("Transform Action",response_spec,0x10);
      local_40 = param_4;
      if (iVar2 == 0) {
        local_58 = (undefined4 *)INT_CMmalloc(0x48);
        __isoc99_sscanf(response_spec + 0x11,"  Input Format Count %d\n",&local_60);
        pcVar3 = strchr(response_spec + 0x11,10);
        pcVar3 = pcVar3 + 1;
        p_Var6 = (FMStructDescList)INT_CMmalloc((long)local_60 * 0x20 + 0x20);
        if (0 < local_60) {
          lVar17 = 0;
          p_Var7 = p_Var6;
          do {
            pcVar3 = parse_FMformat_from_string(pcVar3,p_Var7);
            lVar17 = lVar17 + 1;
            p_Var7 = p_Var7 + 1;
          } while (lVar17 < local_60);
        }
        p_Var6[local_60].format_name = (char *)0x0;
        p_Var6[local_60].field_list = (FMFieldList)0x0;
        iVar2 = __isoc99_sscanf(pcVar3,"  Output Format Count %d\n",&local_60);
        if (iVar2 == 1) {
          pcVar3 = strchr(pcVar3,10);
          pcVar3 = pcVar3 + 1;
          p_Var7 = (FMStructDescList)INT_CMmalloc((long)local_60 * 0x20 + 0x20);
          if (0 < local_60) {
            lVar17 = 0;
            f = p_Var7;
            do {
              pcVar3 = parse_FMformat_from_string(pcVar3,f);
              lVar17 = lVar17 + 1;
              f = f + 1;
            } while (lVar17 < local_60);
          }
          p_Var7[local_60].format_name = (char *)0x0;
          p_Var7[local_60].field_list = (FMFieldList)0x0;
          sVar9 = strlen(pcVar3);
          pcVar10 = (char *)INT_CMmalloc(sVar9 + 1);
          strcpy(pcVar10,pcVar3);
          puVar5 = local_58;
          *local_58 = 1;
          *(FMStructDescList *)(local_58 + 2) = p_Var6;
          *(FMStructDescList *)(local_58 + 4) = p_Var7;
          *(char **)(local_58 + 6) = pcVar10;
          *(void **)(local_58 + 8) = local_40;
          *(undefined8 *)(local_58 + 10) = 0;
          if (p_Var6->format_name != (char *)0x0) {
            p_Var12 = EVregister_format_set(local_48,p_Var6);
            *(FMFormat *)(puVar5 + 10) = p_Var12;
          }
          if (ref_ptr != (FMFormat **)0x0) {
            pp_Var13 = (FMFormat *)INT_CMmalloc(0x10);
            pp_Var13[1] = (FMFormat)0x0;
            *pp_Var13 = *(FMFormat *)(local_58 + 10);
            *ref_ptr = pp_Var13;
          }
          puVar5 = local_58;
          if (p_Var7->format_name != (char *)0x0) {
            p_Var12 = EVregister_format_set(local_48,p_Var7);
            *(FMFormat *)(puVar5 + 0xc) = p_Var12;
          }
          puVar5[0x10] = p_Var7->struct_size;
          return puVar5;
        }
        puts("output format parse failed");
        return (void *)0x0;
      }
      iVar2 = strncmp("Multityped Action",response_spec,0x11);
      if (iVar2 != 0) {
        printf("Unparsed action : %s\n",response_spec);
        return (void *)0x0;
      }
      local_58 = (undefined4 *)INT_CMmalloc(0x48);
      iVar2 = 0;
      __isoc99_sscanf(response_spec + 0x12,"  List Count %d\n",&local_60);
      pcVar3 = strchr(response_spec + 0x12,10);
      pcVar3 = pcVar3 + 1;
      pvVar8 = INT_CMmalloc((long)local_60 * 8 + 8);
      if (0 < local_60) {
        iVar2 = 0;
        iVar15 = 0;
        local_38 = pvVar8;
        do {
          __isoc99_sscanf(pcVar3,"Next format   Subformat Count %d\n",&local_5c);
          pcVar3 = strchr(pcVar3,10);
          pcVar3 = pcVar3 + 1;
          pFVar4 = (FMStructDescRec *)INT_CMmalloc((long)local_5c * 0x20 + 0x20);
          if (0 < local_5c) {
            lVar17 = 0;
            pFVar16 = pFVar4;
            do {
              pcVar3 = parse_FMformat_from_string(pcVar3,pFVar16);
              lVar17 = lVar17 + 1;
              pFVar16 = pFVar16 + 1;
              pvVar8 = local_38;
            } while (lVar17 < local_5c);
          }
          pFVar4[local_5c].format_name = (char *)0x0;
          pFVar4[local_5c].field_list = (FMFieldList)0x0;
          *(FMStructDescRec **)((long)pvVar8 + (long)iVar15 * 8) = pFVar4;
          if (pFVar4->field_list == (FMFieldList)0x0) {
            free(pFVar4->format_name);
            free(pFVar4);
            *(undefined8 *)((long)pvVar8 + (long)iVar15 * 8) = 0;
            local_60 = local_60 + -1;
            iVar15 = iVar15 + -1;
            iVar2 = iVar2 + 1;
          }
          iVar15 = iVar15 + 1;
        } while (iVar15 < local_60);
      }
      *(undefined8 *)((long)pvVar8 + (long)local_60 * 8) = 0;
      sVar9 = strlen(pcVar3);
      pcVar10 = (char *)INT_CMmalloc(sVar9 + 1);
      strcpy(pcVar10,pcVar3);
      puVar5 = local_58;
      *local_58 = 3;
      *(void **)(local_58 + 2) = pvVar8;
      *(char **)(local_58 + 4) = pcVar10;
      *(void **)(local_58 + 6) = local_40;
      local_58[8] = iVar2;
      pvVar11 = INT_CMmalloc((long)local_60 * 8 + 8);
      cm_00 = local_48;
      ppp_Var1 = local_50;
      *(void **)(puVar5 + 10) = pvVar11;
      if (0 < local_60) {
        lVar17 = 0;
        do {
          p_Var6 = *(FMStructDescList *)((long)pvVar8 + lVar17 * 8);
          if (p_Var6->format_name != (char *)0x0) {
            p_Var12 = EVregister_format_set(cm_00,p_Var6);
            *(FMFormat *)(*(long *)(puVar5 + 10) + lVar17 * 8) = p_Var12;
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 < local_60);
      }
      if (ppp_Var1 == (FMFormat **)0x0) {
        return puVar5;
      }
      pp_Var13 = (FMFormat *)INT_CMmalloc((long)local_60 * 8 + 8);
      lVar17 = (long)local_60;
      if (0 < lVar17) {
        lVar14 = 0;
        do {
          pp_Var13[lVar14] = *(FMFormat *)(*(long *)(puVar5 + 10) + lVar14 * 8);
          lVar14 = lVar14 + 1;
        } while (lVar17 != lVar14);
      }
      pp_Var13[lVar17] = (FMFormat)0x0;
      *ppp_Var1 = pp_Var13;
      return puVar5;
    }
    puVar5 = (undefined4 *)INT_CMmalloc(0x48);
    __isoc99_sscanf(response_spec + 0xe,"  Format Count %d\n",&local_60);
    pcVar3 = strchr(response_spec + 0xe,10);
    pcVar3 = pcVar3 + 1;
    p_Var6 = (FMStructDescList)INT_CMmalloc((long)local_60 * 0x20 + 0x20);
    if (0 < local_60) {
      lVar17 = 0;
      p_Var7 = p_Var6;
      do {
        pcVar3 = parse_FMformat_from_string(pcVar3,p_Var7);
        lVar17 = lVar17 + 1;
        p_Var7 = p_Var7 + 1;
      } while (lVar17 < local_60);
    }
    p_Var6[local_60].format_name = (char *)0x0;
    sVar9 = strlen(pcVar3);
    pcVar10 = (char *)INT_CMmalloc(sVar9 + 1);
    strcpy(pcVar10,pcVar3);
    *puVar5 = 2;
  }
  *(FMStructDescList *)(puVar5 + 2) = p_Var6;
  *(char **)(puVar5 + 4) = pcVar10;
  *(void **)(puVar5 + 6) = param_4;
  p_Var12 = EVregister_format_set(local_48,p_Var6);
  ppp_Var1 = local_50;
  *(FMFormat *)(puVar5 + 8) = p_Var12;
  if (local_50 != (FMFormat **)0x0) {
    pp_Var13 = (FMFormat *)INT_CMmalloc(0x10);
    pp_Var13[1] = (FMFormat)0x0;
    *pp_Var13 = *(FMFormat *)(puVar5 + 8);
    *ppp_Var1 = pp_Var13;
  }
  return puVar5;
}

Assistant:

void *
install_response_handler(CManager cm, int stone_id, char *response_spec,
			 void *local_data, FMFormat **ref_ptr)
{
    char *str = response_spec;
    (void)stone_id;
    if (strncmp("Terminal Action", str, strlen("Terminal Action")) == 0) {
	int format_count, i;
	FMStructDescList list;
	str += strlen("Terminal Action") + 1;
	sscanf(str, "  Format Count %d\n", &format_count);
	str = strchr(str, '\n') + 1;
	list = malloc(sizeof(list[0]) * (format_count + 1));
	for (i=0; i < format_count; i++) {
	    str = parse_FMformat_from_string(str, &list[i]);
	}
	list[format_count].format_name = NULL;
/*	INT_EVassoc_terminal_action(cm, stone_id, list, local_data, NULL);*/
    }
    if (strncmp("Filter Action", str, strlen("Filter Action")) == 0) {
	struct response_spec *response = malloc(sizeof(struct response_spec));
	int format_count, i;
	char *function;
	FMStructDescList list;
	str += strlen("Filter Action") + 1;
	sscanf(str, "  Format Count %d\n", &format_count);
	str = strchr(str, '\n') + 1;
	list = malloc(sizeof(list[0]) * (format_count + 1));
	for (i=0; i < format_count; i++) {
	    str = parse_FMformat_from_string(str, &list[i]);
	}
	list[format_count].format_name = NULL;
	function = malloc(strlen(str) + 1);
	strcpy(function, str);
	response->response_type = Response_Filter;
	response->u.filter.format_list = list;
	response->u.filter.function = function;
	response->u.filter.client_data = local_data;
	response->u.filter.reference_format =
	    EVregister_format_set(cm, list);
	if (ref_ptr) {
	    FMFormat *formats = malloc(2*sizeof(FMFormat));
	    formats[1] = NULL;
	    formats[0] = response->u.filter.reference_format;

	    *ref_ptr = formats;
	}
	return (void*)response;
    }
    if (strncmp("Router Action", str, strlen("Router Action")) == 0) {
	struct response_spec *response = malloc(sizeof(struct response_spec));
	int format_count, i;
	char *function;
	FMStructDescList list;
	str += strlen("Router Action") + 1;
	sscanf(str, "  Format Count %d\n", &format_count);
	str = strchr(str, '\n') + 1;
	list = malloc(sizeof(list[0]) * (format_count + 1));
	for (i=0; i < format_count; i++) {
	    str = parse_FMformat_from_string(str, &list[i]);
	}
	list[format_count].format_name = NULL;
	function = malloc(strlen(str) + 1);
	strcpy(function, str);
	response->response_type = Response_Router;
	response->u.filter.format_list = list;
	response->u.filter.function = function;
	response->u.filter.client_data = local_data;
	response->u.filter.reference_format =
	    EVregister_format_set(cm, list);
	if (ref_ptr) {
	    FMFormat *formats = malloc(2*sizeof(FMFormat));
	    formats[1] = NULL;
	    formats[0] = response->u.filter.reference_format;

	    *ref_ptr = formats;
	}
	return (void*)response;
    }
    if (strncmp("Transform Action", str, strlen("Transform Action")) == 0) {
	struct response_spec *response = malloc(sizeof(struct response_spec));
	int format_count, i;
	char *function;
	FMStructDescList in_list, out_list;
	str += strlen("Transform Action") + 1;
	sscanf(str, "  Input Format Count %d\n", &format_count);
	str = strchr(str, '\n') + 1;
	in_list = malloc(sizeof(in_list[0]) * (format_count + 1));
	for (i=0; i < format_count; i++) {
	    str = parse_FMformat_from_string(str, &in_list[i]);
	}
	in_list[format_count].format_name = NULL;
	in_list[format_count].field_list = NULL;
	if (sscanf(str, "  Output Format Count %d\n", &format_count) != 1) {
	    printf("output format parse failed\n");
	    return 0;
	}
	str = strchr(str, '\n') + 1;
	out_list = malloc(sizeof(out_list[0]) * (format_count + 1));
	for (i=0; i < format_count; i++) {
	    str = parse_FMformat_from_string(str, &out_list[i]);
	}
	out_list[format_count].format_name = NULL;
	out_list[format_count].field_list = NULL;
	function = malloc(strlen(str) + 1);
	strcpy(function, str);
	response->response_type = Response_Transform;
	response->u.transform.in_format_list = in_list;
	response->u.transform.out_format_list = out_list;
	response->u.transform.function = function;
	response->u.transform.client_data = local_data;
	response->u.transform.reference_input_format = NULL;
	if (in_list[0].format_name != NULL)
	    response->u.transform.reference_input_format =
		EVregister_format_set(cm, in_list);
	if (ref_ptr) {
	    FMFormat *formats = malloc(2*sizeof(FMFormat));
	    formats[1] = NULL;
	    formats[0] = response->u.transform.reference_input_format;
	    *ref_ptr = formats;
	}
	if (out_list[0].format_name != NULL)
	    response->u.transform.reference_output_format =
		EVregister_format_set(cm, out_list);
	response->u.transform.output_base_struct_size = out_list[0].struct_size;
	return (void*)response;
    }
    if (strncmp("Multityped Action", str, strlen("Multityped Action")) == 0) {
	struct response_spec *response = malloc(sizeof(struct response_spec));
	int list_count, j;
	char *function;
	FMStructDescList *struct_list;
	int accept_anonymous = 0;

	str += strlen("Multityped Action") + 1;
	sscanf(str, "  List Count %d\n", &list_count);
	str = strchr(str, '\n') + 1;
	struct_list = malloc(sizeof(struct_list[0]) * (list_count + 1));
	for (j = 0; j < list_count; j++) {
	    int format_count2, k;
	    FMStructDescList in_list;
	    sscanf(str, "Next format   Subformat Count %d\n", &format_count2);
	    str = strchr(str, '\n') + 1;

	    in_list = malloc(sizeof(in_list[0]) * (format_count2 + 1));
	    for (k=0; k < format_count2; k++) {
		str = parse_FMformat_from_string(str, &in_list[k]);
	    }
	    in_list[format_count2].format_name = NULL;
	    in_list[format_count2].field_list = NULL;
	    struct_list[j] = in_list;
	    if (struct_list[j]->field_list == NULL) {  /* anonymous */
		free((void*)struct_list[j]->format_name);
		free(in_list);
		struct_list[j] = NULL;
		list_count--;
		j--;
		accept_anonymous++;
	    }
	}
	struct_list[list_count] = NULL;
	function = malloc(strlen(str) + 1);
	strcpy(function, str);
	response->response_type = Response_Multityped;
	response->u.multityped.struct_list = struct_list;
	response->u.multityped.function = function;
	response->u.multityped.client_data = local_data;
	response->u.multityped.accept_anonymous = accept_anonymous;
	response->u.multityped.reference_input_format_list =
	    malloc((list_count +1) * sizeof(FMFormat));
	for (j = 0; j < list_count; j++) {
	    if ((struct_list[j])[0].format_name != NULL) {
		response->u.multityped.reference_input_format_list[j] =
		    EVregister_format_set(cm, struct_list[j]);
	    }
	}
	if (ref_ptr) {
	    FMFormat *formats = malloc((list_count + 1)*sizeof(FMFormat));
	    int k = 0;
	    for (k=0; k < list_count; k++) {
		formats[k] = response->u.multityped.reference_input_format_list[k];
	    }
	    formats[list_count] = NULL;
	    *ref_ptr = formats;
	}
	return (void*)response;
    }
    printf("Unparsed action : %s\n", str);
    return NULL;
}